

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O1

Result __thiscall
testing::internal::FunctionMocker<const_solitaire::interfaces::Solitaire_&()>::Invoke
          (FunctionMocker<const_solitaire::interfaces::Solitaire_&()> *this)

{
  Result pSVar1;
  uint3 in_EAX;
  UntypedActionResultHolderBase *pUVar2;
  long lVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  bool bVar4;
  ArgumentTuple tuple;
  ulong uVar5;
  
  uVar5 = (ulong)in_EAX;
  pUVar2 = UntypedFunctionMockerBase::UntypedInvokeWith
                     (&this->super_UntypedFunctionMockerBase,&stack0xffffffffffffffeb);
  if (pUVar2 == (UntypedActionResultHolderBase *)0x0) {
    bVar4 = true;
  }
  else {
    lVar3 = __dynamic_cast(pUVar2,&UntypedActionResultHolderBase::typeinfo,
                           &ActionResultHolder<solitaire::interfaces::Solitaire_const&>::typeinfo,0,
                           in_R8,in_R9,uVar5);
    bVar4 = lVar3 != 0;
  }
  bVar4 = IsTrue(bVar4);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&stack0xffffffffffffffec,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x44d);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition f == nullptr || dynamic_cast<To>(f) != nullptr failed. ",0x41);
    GTestLog::~GTestLog((GTestLog *)&stack0xffffffffffffffec);
  }
  pSVar1 = (Result)pUVar2[1]._vptr_UntypedActionResultHolderBase;
  if (pUVar2 != (UntypedActionResultHolderBase *)0x0) {
    (*pUVar2->_vptr_UntypedActionResultHolderBase[1])(pUVar2);
  }
  return pSVar1;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }